

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O2

void av1_get_nz_map_contexts_sse2
               (uint8_t *levels,int16_t *scan,uint16_t eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int8_t *coeff_contexts)

{
  int8_t *piVar1;
  short sVar2;
  int real_height;
  byte bVar3;
  int iVar4;
  __m128i *palVar5;
  int iVar6;
  undefined6 in_register_00000012;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int8_t *piVar11;
  int height;
  int iVar12;
  char extraout_XMM0_Ba;
  char extraout_XMM0_Ba_00;
  char extraout_XMM0_Ba_01;
  char extraout_XMM0_Ba_02;
  char extraout_XMM0_Ba_03;
  char extraout_XMM0_Ba_04;
  char extraout_XMM0_Ba_05;
  char extraout_XMM0_Ba_06;
  char extraout_XMM0_Bb;
  char extraout_XMM0_Bb_00;
  char extraout_XMM0_Bb_01;
  char extraout_XMM0_Bb_02;
  char extraout_XMM0_Bb_03;
  char extraout_XMM0_Bb_04;
  char extraout_XMM0_Bb_05;
  char extraout_XMM0_Bb_06;
  char extraout_XMM0_Bc;
  char extraout_XMM0_Bc_00;
  char extraout_XMM0_Bc_01;
  char extraout_XMM0_Bc_02;
  char extraout_XMM0_Bc_03;
  char extraout_XMM0_Bc_04;
  char extraout_XMM0_Bc_05;
  char extraout_XMM0_Bc_06;
  char extraout_XMM0_Bd;
  char extraout_XMM0_Bd_00;
  char extraout_XMM0_Bd_01;
  char extraout_XMM0_Bd_02;
  char extraout_XMM0_Bd_03;
  char extraout_XMM0_Bd_04;
  char extraout_XMM0_Bd_05;
  char extraout_XMM0_Bd_06;
  char extraout_XMM0_Be;
  char extraout_XMM0_Be_00;
  char extraout_XMM0_Be_01;
  char extraout_XMM0_Be_02;
  char extraout_XMM0_Be_03;
  char extraout_XMM0_Be_04;
  char extraout_XMM0_Be_05;
  char extraout_XMM0_Be_06;
  char extraout_XMM0_Bf;
  char extraout_XMM0_Bf_00;
  char extraout_XMM0_Bf_01;
  char extraout_XMM0_Bf_02;
  char extraout_XMM0_Bf_03;
  char extraout_XMM0_Bf_04;
  char extraout_XMM0_Bf_05;
  char extraout_XMM0_Bf_06;
  char extraout_XMM0_Bg;
  char extraout_XMM0_Bg_00;
  char extraout_XMM0_Bg_01;
  char extraout_XMM0_Bg_02;
  char extraout_XMM0_Bg_03;
  char extraout_XMM0_Bg_04;
  char extraout_XMM0_Bg_05;
  char extraout_XMM0_Bg_06;
  char extraout_XMM0_Bh;
  char extraout_XMM0_Bh_00;
  char extraout_XMM0_Bh_01;
  char extraout_XMM0_Bh_02;
  char extraout_XMM0_Bh_03;
  char extraout_XMM0_Bh_04;
  char extraout_XMM0_Bh_05;
  char extraout_XMM0_Bh_06;
  char extraout_XMM0_Bi;
  char extraout_XMM0_Bi_00;
  char extraout_XMM0_Bi_01;
  char extraout_XMM0_Bi_02;
  char extraout_XMM0_Bi_03;
  char extraout_XMM0_Bi_04;
  char extraout_XMM0_Bi_05;
  char extraout_XMM0_Bi_06;
  char extraout_XMM0_Bj;
  char extraout_XMM0_Bj_00;
  char extraout_XMM0_Bj_01;
  char extraout_XMM0_Bj_02;
  char extraout_XMM0_Bj_03;
  char extraout_XMM0_Bj_04;
  char extraout_XMM0_Bj_05;
  char extraout_XMM0_Bj_06;
  char extraout_XMM0_Bk;
  char extraout_XMM0_Bk_00;
  char extraout_XMM0_Bk_01;
  char extraout_XMM0_Bk_02;
  char extraout_XMM0_Bk_03;
  char extraout_XMM0_Bk_04;
  char extraout_XMM0_Bk_05;
  char extraout_XMM0_Bk_06;
  char extraout_XMM0_Bl;
  char extraout_XMM0_Bl_00;
  char extraout_XMM0_Bl_01;
  char extraout_XMM0_Bl_02;
  char extraout_XMM0_Bl_03;
  char extraout_XMM0_Bl_04;
  char extraout_XMM0_Bl_05;
  char extraout_XMM0_Bl_06;
  char extraout_XMM0_Bm;
  char extraout_XMM0_Bm_00;
  char extraout_XMM0_Bm_01;
  char extraout_XMM0_Bm_02;
  char extraout_XMM0_Bm_03;
  char extraout_XMM0_Bm_04;
  char extraout_XMM0_Bm_05;
  char extraout_XMM0_Bm_06;
  char extraout_XMM0_Bn;
  char extraout_XMM0_Bn_00;
  char extraout_XMM0_Bn_01;
  char extraout_XMM0_Bn_02;
  char extraout_XMM0_Bn_03;
  char extraout_XMM0_Bn_04;
  char extraout_XMM0_Bn_05;
  char extraout_XMM0_Bn_06;
  char extraout_XMM0_Bo;
  char extraout_XMM0_Bo_00;
  char extraout_XMM0_Bo_01;
  char extraout_XMM0_Bo_02;
  char extraout_XMM0_Bo_03;
  char extraout_XMM0_Bo_04;
  char extraout_XMM0_Bo_05;
  char extraout_XMM0_Bo_06;
  char extraout_XMM0_Bp;
  char extraout_XMM0_Bp_00;
  char extraout_XMM0_Bp_01;
  char extraout_XMM0_Bp_02;
  char extraout_XMM0_Bp_03;
  char extraout_XMM0_Bp_04;
  char extraout_XMM0_Bp_05;
  char extraout_XMM0_Bp_06;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ptrdiff_t offsets [3];
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  int stride;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  __m128i level [5];
  
  iVar6 = (int)CONCAT62(in_register_00000012,eob) + -1;
  if (iVar6 == 0) {
    *coeff_contexts = '\0';
    return;
  }
  iVar4 = *(int *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
  real_height = *(int *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
  bVar3 = av1_get_adjusted_tx_size(tx_size);
  uVar7 = (ulong)bVar3;
  iVar12 = tx_size_wide[bVar3];
  height = tx_size_high[bVar3];
  lVar10 = (long)height + 4;
  if (tx_class == '\x01') {
    iVar4 = (int)lVar10;
    offsets[0] = (ptrdiff_t)(iVar4 * 2);
    offsets[1] = (ptrdiff_t)(iVar4 * 3);
    palVar5 = (__m128i *)(long)(iVar4 * 4);
    offsets[2] = (ptrdiff_t)palVar5;
    if (height == 8) {
      uVar13 = 0x1a1a1a1a1a1a1a1a;
      uVar15 = 0x1f1f1f1f1f1f1f1f;
      lVar10 = 0;
      do {
        load_levels_8x2x5_sse2(levels,(int)offsets,level[0],palVar5);
        get_coeff_contexts_kernel_sse2(level);
        local_d8 = (char)uVar13;
        cStack_d7 = (char)((ulong)uVar13 >> 8);
        cStack_d6 = (char)((ulong)uVar13 >> 0x10);
        cStack_d5 = (char)((ulong)uVar13 >> 0x18);
        cStack_d4 = (char)((ulong)uVar13 >> 0x20);
        cStack_d3 = (char)((ulong)uVar13 >> 0x28);
        cStack_d2 = (char)((ulong)uVar13 >> 0x30);
        cStack_d1 = (char)((ulong)uVar13 >> 0x38);
        cStack_d0 = (char)uVar15;
        cStack_cf = (char)((ulong)uVar15 >> 8);
        cStack_ce = (char)((ulong)uVar15 >> 0x10);
        cStack_cd = (char)((ulong)uVar15 >> 0x18);
        cStack_cc = (char)((ulong)uVar15 >> 0x20);
        cStack_cb = (char)((ulong)uVar15 >> 0x28);
        cStack_ca = (char)((ulong)uVar15 >> 0x30);
        cStack_c9 = (char)((ulong)uVar15 >> 0x38);
        piVar11 = coeff_contexts + lVar10 * 8;
        *piVar11 = extraout_XMM0_Ba_01 + local_d8;
        piVar11[1] = extraout_XMM0_Bb_01 + cStack_d7;
        piVar11[2] = extraout_XMM0_Bc_01 + cStack_d6;
        piVar11[3] = extraout_XMM0_Bd_01 + cStack_d5;
        piVar11[4] = extraout_XMM0_Be_01 + cStack_d4;
        piVar11[5] = extraout_XMM0_Bf_01 + cStack_d3;
        piVar11[6] = extraout_XMM0_Bg_01 + cStack_d2;
        piVar11[7] = extraout_XMM0_Bh_01 + cStack_d1;
        piVar11[8] = extraout_XMM0_Bi_01 + cStack_d0;
        piVar11[9] = extraout_XMM0_Bj_01 + cStack_cf;
        piVar11[10] = extraout_XMM0_Bk_01 + cStack_ce;
        piVar11[0xb] = extraout_XMM0_Bl_01 + cStack_cd;
        piVar11[0xc] = extraout_XMM0_Bm_01 + cStack_cc;
        piVar11[0xd] = extraout_XMM0_Bn_01 + cStack_cb;
        piVar11[0xe] = extraout_XMM0_Bo_01 + cStack_ca;
        piVar11[0xf] = extraout_XMM0_Bp_01 + cStack_c9;
        levels = levels + 0x18;
        lVar10 = lVar10 + 2;
        uVar13 = 0x2424242424242424;
        uVar15 = 0x2424242424242424;
      } while (iVar12 != (int)lVar10);
    }
    else if (height == 4) {
      uVar13 = 0x1f1f1f1f1a1a1a1a;
      lVar10 = 0;
      do {
        load_levels_4x4x5_sse2(levels,(int)offsets,level[0],palVar5);
        get_coeff_contexts_kernel_sse2(level);
        local_d8 = (char)uVar13;
        cStack_d7 = (char)((ulong)uVar13 >> 8);
        cStack_d6 = (char)((ulong)uVar13 >> 0x10);
        cStack_d5 = (char)((ulong)uVar13 >> 0x18);
        cStack_d4 = (char)((ulong)uVar13 >> 0x20);
        cStack_d3 = (char)((ulong)uVar13 >> 0x28);
        cStack_d2 = (char)((ulong)uVar13 >> 0x30);
        cStack_d1 = (char)((ulong)uVar13 >> 0x38);
        piVar11 = coeff_contexts + lVar10 * 4;
        *piVar11 = extraout_XMM0_Ba + local_d8;
        piVar11[1] = extraout_XMM0_Bb + cStack_d7;
        piVar11[2] = extraout_XMM0_Bc + cStack_d6;
        piVar11[3] = extraout_XMM0_Bd + cStack_d5;
        piVar11[4] = extraout_XMM0_Be + cStack_d4;
        piVar11[5] = extraout_XMM0_Bf + cStack_d3;
        piVar11[6] = extraout_XMM0_Bg + cStack_d2;
        piVar11[7] = extraout_XMM0_Bh + cStack_d1;
        piVar11[8] = extraout_XMM0_Bi + '$';
        piVar11[9] = extraout_XMM0_Bj + '$';
        piVar11[10] = extraout_XMM0_Bk + '$';
        piVar11[0xb] = extraout_XMM0_Bl + '$';
        piVar11[0xc] = extraout_XMM0_Bm + '$';
        piVar11[0xd] = extraout_XMM0_Bn + '$';
        piVar11[0xe] = extraout_XMM0_Bo + '$';
        piVar11[0xf] = extraout_XMM0_Bp + '$';
        levels = levels + 0x20;
        lVar10 = lVar10 + 4;
        uVar13 = 0x2424242424242424;
      } while (iVar12 != (int)lVar10);
    }
    else {
      piVar11 = coeff_contexts;
      uVar13 = 0x1a1a1a1a1a1a1a1a;
      uVar15 = 0x1a1a1a1a1a1a1a1a;
      uVar14 = 0x1f1f1f1f1f1f1f1f;
      uVar16 = 0x1f1f1f1f1f1f1f1f;
      iVar4 = iVar12;
      do {
        lVar9 = 0;
        do {
          lVar8 = lVar9;
          level[0][0] = *(longlong *)(levels + lVar8 + 1);
          level[0][1] = *(longlong *)((long)(levels + lVar8 + 1) + 8);
          level[1][0] = *(longlong *)(levels + lVar8 + lVar10);
          level[1][1] = *(longlong *)((long)(levels + lVar8 + lVar10) + 8);
          level[2][0] = *(longlong *)(levels + offsets[0] + lVar8);
          level[2][1] = *(longlong *)((long)(levels + offsets[0] + lVar8) + 8);
          level[3][0] = *(longlong *)(levels + offsets[1] + lVar8);
          level[3][1] = *(longlong *)((long)(levels + offsets[1] + lVar8) + 8);
          level[4][0] = *(longlong *)(levels + offsets[2] + lVar8);
          level[4][1] = *(longlong *)((long)(levels + offsets[2] + lVar8) + 8);
          get_coeff_contexts_kernel_sse2(level);
          local_d8 = (char)uVar13;
          cStack_d7 = (char)((ulong)uVar13 >> 8);
          cStack_d6 = (char)((ulong)uVar13 >> 0x10);
          cStack_d5 = (char)((ulong)uVar13 >> 0x18);
          cStack_d4 = (char)((ulong)uVar13 >> 0x20);
          cStack_d3 = (char)((ulong)uVar13 >> 0x28);
          cStack_d2 = (char)((ulong)uVar13 >> 0x30);
          cStack_d1 = (char)((ulong)uVar13 >> 0x38);
          cStack_d0 = (char)uVar15;
          cStack_cf = (char)((ulong)uVar15 >> 8);
          cStack_ce = (char)((ulong)uVar15 >> 0x10);
          cStack_cd = (char)((ulong)uVar15 >> 0x18);
          cStack_cc = (char)((ulong)uVar15 >> 0x20);
          cStack_cb = (char)((ulong)uVar15 >> 0x28);
          cStack_ca = (char)((ulong)uVar15 >> 0x30);
          cStack_c9 = (char)((ulong)uVar15 >> 0x38);
          piVar1 = piVar11 + lVar8;
          *piVar1 = extraout_XMM0_Ba_02 + local_d8;
          piVar1[1] = extraout_XMM0_Bb_02 + cStack_d7;
          piVar1[2] = extraout_XMM0_Bc_02 + cStack_d6;
          piVar1[3] = extraout_XMM0_Bd_02 + cStack_d5;
          piVar1[4] = extraout_XMM0_Be_02 + cStack_d4;
          piVar1[5] = extraout_XMM0_Bf_02 + cStack_d3;
          piVar1[6] = extraout_XMM0_Bg_02 + cStack_d2;
          piVar1[7] = extraout_XMM0_Bh_02 + cStack_d1;
          piVar1[8] = extraout_XMM0_Bi_02 + cStack_d0;
          piVar1[9] = extraout_XMM0_Bj_02 + cStack_cf;
          piVar1[10] = extraout_XMM0_Bk_02 + cStack_ce;
          piVar1[0xb] = extraout_XMM0_Bl_02 + cStack_cd;
          piVar1[0xc] = extraout_XMM0_Bm_02 + cStack_cc;
          piVar1[0xd] = extraout_XMM0_Bn_02 + cStack_cb;
          piVar1[0xe] = extraout_XMM0_Bo_02 + cStack_ca;
          piVar1[0xf] = extraout_XMM0_Bp_02 + cStack_c9;
          lVar9 = lVar8 + 0x10;
        } while (height != (int)lVar9);
        levels = levels + lVar8 + 0x14;
        piVar11 = piVar11 + lVar9;
        iVar4 = iVar4 + -1;
        uVar13 = uVar14;
        uVar15 = uVar16;
        uVar14 = 0x2424242424242424;
        uVar16 = 0x2424242424242424;
      } while (iVar4 != 0);
    }
    goto LAB_0031567a;
  }
  palVar5 = (__m128i *)(ulong)tx_class;
  if (tx_class != '\0') {
    offsets[0] = 2;
    offsets[1] = 3;
    offsets[2] = 4;
    if (height == 8) {
      lVar10 = 0;
      do {
        load_levels_8x2x5_sse2(levels,(int)offsets,level[0],palVar5);
        get_coeff_contexts_kernel_sse2(level);
        piVar11 = coeff_contexts + lVar10 * 8;
        *piVar11 = extraout_XMM0_Ba_03 + '\x1a';
        piVar11[1] = extraout_XMM0_Bb_03 + '\x1f';
        piVar11[2] = extraout_XMM0_Bc_03 + '$';
        piVar11[3] = extraout_XMM0_Bd_03 + '$';
        piVar11[4] = extraout_XMM0_Be_03 + '$';
        piVar11[5] = extraout_XMM0_Bf_03 + '$';
        piVar11[6] = extraout_XMM0_Bg_03 + '$';
        piVar11[7] = extraout_XMM0_Bh_03 + '$';
        piVar11[8] = extraout_XMM0_Bi_03 + '\x1a';
        piVar11[9] = extraout_XMM0_Bj_03 + '\x1f';
        piVar11[10] = extraout_XMM0_Bk_03 + '$';
        piVar11[0xb] = extraout_XMM0_Bl_03 + '$';
        piVar11[0xc] = extraout_XMM0_Bm_03 + '$';
        piVar11[0xd] = extraout_XMM0_Bn_03 + '$';
        piVar11[0xe] = extraout_XMM0_Bo_03 + '$';
        piVar11[0xf] = extraout_XMM0_Bp_03 + '$';
        levels = levels + 0x18;
        lVar10 = lVar10 + 2;
      } while (iVar12 != (int)lVar10);
    }
    else if (height == 4) {
      lVar10 = 0;
      do {
        load_levels_4x4x5_sse2(levels,(int)offsets,level[0],palVar5);
        get_coeff_contexts_kernel_sse2(level);
        piVar11 = coeff_contexts + lVar10 * 4;
        *piVar11 = extraout_XMM0_Ba_00 + '\x1a';
        piVar11[1] = extraout_XMM0_Bb_00 + '\x1f';
        piVar11[2] = extraout_XMM0_Bc_00 + '$';
        piVar11[3] = extraout_XMM0_Bd_00 + '$';
        piVar11[4] = extraout_XMM0_Be_00 + '\x1a';
        piVar11[5] = extraout_XMM0_Bf_00 + '\x1f';
        piVar11[6] = extraout_XMM0_Bg_00 + '$';
        piVar11[7] = extraout_XMM0_Bh_00 + '$';
        piVar11[8] = extraout_XMM0_Bi_00 + '\x1a';
        piVar11[9] = extraout_XMM0_Bj_00 + '\x1f';
        piVar11[10] = extraout_XMM0_Bk_00 + '$';
        piVar11[0xb] = extraout_XMM0_Bl_00 + '$';
        piVar11[0xc] = extraout_XMM0_Bm_00 + '\x1a';
        piVar11[0xd] = extraout_XMM0_Bn_00 + '\x1f';
        piVar11[0xe] = extraout_XMM0_Bo_00 + '$';
        piVar11[0xf] = extraout_XMM0_Bp_00 + '$';
        levels = levels + 0x20;
        lVar10 = lVar10 + 4;
      } while (iVar12 != (int)lVar10);
    }
    else {
      piVar11 = coeff_contexts;
      iVar4 = iVar12;
      do {
        lVar9 = 0;
        uVar13 = 0x2424242424241f1a;
        do {
          lVar8 = lVar9;
          level[0][0] = *(longlong *)(levels + lVar8 + 1);
          level[0][1] = *(longlong *)((long)(levels + lVar8 + 1) + 8);
          level[1][0] = *(longlong *)(levels + lVar8 + lVar10);
          level[1][1] = *(longlong *)((long)(levels + lVar8 + lVar10) + 8);
          level[2][0] = *(longlong *)(levels + offsets[0] + lVar8);
          level[2][1] = *(longlong *)((long)(levels + offsets[0] + lVar8) + 8);
          level[3][0] = *(longlong *)(levels + offsets[1] + lVar8);
          level[3][1] = *(longlong *)((long)(levels + offsets[1] + lVar8) + 8);
          level[4][0] = *(longlong *)(levels + offsets[2] + lVar8);
          level[4][1] = *(longlong *)((long)(levels + offsets[2] + lVar8) + 8);
          get_coeff_contexts_kernel_sse2(level);
          local_d8 = (char)uVar13;
          cStack_d7 = (char)((ulong)uVar13 >> 8);
          cStack_d6 = (char)((ulong)uVar13 >> 0x10);
          cStack_d5 = (char)((ulong)uVar13 >> 0x18);
          cStack_d4 = (char)((ulong)uVar13 >> 0x20);
          cStack_d3 = (char)((ulong)uVar13 >> 0x28);
          cStack_d2 = (char)((ulong)uVar13 >> 0x30);
          cStack_d1 = (char)((ulong)uVar13 >> 0x38);
          piVar1 = piVar11 + lVar8;
          *piVar1 = extraout_XMM0_Ba_04 + local_d8;
          piVar1[1] = extraout_XMM0_Bb_04 + cStack_d7;
          piVar1[2] = extraout_XMM0_Bc_04 + cStack_d6;
          piVar1[3] = extraout_XMM0_Bd_04 + cStack_d5;
          piVar1[4] = extraout_XMM0_Be_04 + cStack_d4;
          piVar1[5] = extraout_XMM0_Bf_04 + cStack_d3;
          piVar1[6] = extraout_XMM0_Bg_04 + cStack_d2;
          piVar1[7] = extraout_XMM0_Bh_04 + cStack_d1;
          piVar1[8] = extraout_XMM0_Bi_04 + '$';
          piVar1[9] = extraout_XMM0_Bj_04 + '$';
          piVar1[10] = extraout_XMM0_Bk_04 + '$';
          piVar1[0xb] = extraout_XMM0_Bl_04 + '$';
          piVar1[0xc] = extraout_XMM0_Bm_04 + '$';
          piVar1[0xd] = extraout_XMM0_Bn_04 + '$';
          piVar1[0xe] = extraout_XMM0_Bo_04 + '$';
          piVar1[0xf] = extraout_XMM0_Bp_04 + '$';
          lVar9 = lVar8 + 0x10;
          uVar13 = 0x2424242424242424;
        } while (height != (int)lVar9);
        levels = levels + lVar8 + 0x14;
        piVar11 = piVar11 + lVar9;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    goto LAB_0031567a;
  }
  offsets[0] = 2;
  offsets[1] = (long)height + 5;
  offsets[2] = lVar10 * 2;
  if (height == 0x10) {
    height = 0x10;
LAB_003155a4:
    get_16n_coeff_contexts_2d(levels,iVar4,real_height,iVar12,height,offsets,coeff_contexts);
  }
  else {
    if (height == 8) {
      uVar13 = 0x1515151515150606;
      uVar15 = 0x1515151515151506;
      if ((0x80c2UL >> (uVar7 & 0x3f) & 1) == 0) {
        if ((0x2021UL >> (uVar7 & 0x3f) & 1) == 0) {
          uVar14 = 0x1010101010101000;
          uVar16 = 0x1010101010101010;
        }
        else {
          uVar14 = 0x1515151506060b00;
          uVar16 = 0x1515151515060b0b;
          uVar13 = 0x1515151515150b0b;
          uVar15 = 0x1515151515150b0b;
        }
      }
      else {
        uVar14 = 0x1515151506060100;
        uVar16 = 0x1515151515060601;
      }
      lVar10 = 0;
      do {
        load_levels_8x2x5_sse2(levels,(int)offsets,level[0],palVar5);
        get_coeff_contexts_kernel_sse2(level);
        stride._0_1_ = (char)uVar14;
        stride._1_1_ = (char)((ulong)uVar14 >> 8);
        stride._2_1_ = (char)((ulong)uVar14 >> 0x10);
        stride._3_1_ = (char)((ulong)uVar14 >> 0x18);
        cStack_b4 = (char)((ulong)uVar14 >> 0x20);
        cStack_b3 = (char)((ulong)uVar14 >> 0x28);
        cStack_b2 = (char)((ulong)uVar14 >> 0x30);
        cStack_b1 = (char)((ulong)uVar14 >> 0x38);
        cStack_b0 = (char)uVar16;
        cStack_af = (char)((ulong)uVar16 >> 8);
        cStack_ae = (char)((ulong)uVar16 >> 0x10);
        cStack_ad = (char)((ulong)uVar16 >> 0x18);
        cStack_ac = (char)((ulong)uVar16 >> 0x20);
        cStack_ab = (char)((ulong)uVar16 >> 0x28);
        cStack_aa = (char)((ulong)uVar16 >> 0x30);
        cStack_a9 = (char)((ulong)uVar16 >> 0x38);
        piVar11 = coeff_contexts + lVar10 * 8;
        *piVar11 = extraout_XMM0_Ba_06 + (char)stride;
        piVar11[1] = extraout_XMM0_Bb_06 + stride._1_1_;
        piVar11[2] = extraout_XMM0_Bc_06 + stride._2_1_;
        piVar11[3] = extraout_XMM0_Bd_06 + stride._3_1_;
        piVar11[4] = extraout_XMM0_Be_06 + cStack_b4;
        piVar11[5] = extraout_XMM0_Bf_06 + cStack_b3;
        piVar11[6] = extraout_XMM0_Bg_06 + cStack_b2;
        piVar11[7] = extraout_XMM0_Bh_06 + cStack_b1;
        piVar11[8] = extraout_XMM0_Bi_06 + cStack_b0;
        piVar11[9] = extraout_XMM0_Bj_06 + cStack_af;
        piVar11[10] = extraout_XMM0_Bk_06 + cStack_ae;
        piVar11[0xb] = extraout_XMM0_Bl_06 + cStack_ad;
        piVar11[0xc] = extraout_XMM0_Bm_06 + cStack_ac;
        piVar11[0xd] = extraout_XMM0_Bn_06 + cStack_ab;
        piVar11[0xe] = extraout_XMM0_Bo_06 + cStack_aa;
        piVar11[0xf] = extraout_XMM0_Bp_06 + cStack_a9;
        levels = levels + 0x18;
        lVar10 = lVar10 + 2;
        uVar14 = uVar13;
        uVar16 = uVar15;
        uVar13 = 0x1515151515151515;
        uVar15 = 0x1515151515151515;
      } while (iVar12 != (int)lVar10);
    }
    else {
      if (height != 4) goto LAB_003155a4;
      if ((0x2021UL >> (uVar7 & 0x3f) & 1) == 0) {
        uVar13 = 0x1010101010101000;
      }
      else {
        uVar13 = 0x1506060106060100;
      }
      uVar15 = 0x1515150615150606;
      lVar10 = 0;
      do {
        load_levels_4x4x5_sse2(levels,(int)offsets,level[0],palVar5);
        get_coeff_contexts_kernel_sse2(level);
        local_d8 = (char)uVar13;
        cStack_d7 = (char)((ulong)uVar13 >> 8);
        cStack_d6 = (char)((ulong)uVar13 >> 0x10);
        cStack_d5 = (char)((ulong)uVar13 >> 0x18);
        cStack_d4 = (char)((ulong)uVar13 >> 0x20);
        cStack_d3 = (char)((ulong)uVar13 >> 0x28);
        cStack_d2 = (char)((ulong)uVar13 >> 0x30);
        cStack_d1 = (char)((ulong)uVar13 >> 0x38);
        cStack_d0 = (char)uVar15;
        cStack_cf = (char)((ulong)uVar15 >> 8);
        cStack_ce = (char)((ulong)uVar15 >> 0x10);
        cStack_cd = (char)((ulong)uVar15 >> 0x18);
        cStack_cc = (char)((ulong)uVar15 >> 0x20);
        cStack_cb = (char)((ulong)uVar15 >> 0x28);
        cStack_ca = (char)((ulong)uVar15 >> 0x30);
        cStack_c9 = (char)((ulong)uVar15 >> 0x38);
        piVar11 = coeff_contexts + lVar10 * 4;
        *piVar11 = extraout_XMM0_Ba_05 + local_d8;
        piVar11[1] = extraout_XMM0_Bb_05 + cStack_d7;
        piVar11[2] = extraout_XMM0_Bc_05 + cStack_d6;
        piVar11[3] = extraout_XMM0_Bd_05 + cStack_d5;
        piVar11[4] = extraout_XMM0_Be_05 + cStack_d4;
        piVar11[5] = extraout_XMM0_Bf_05 + cStack_d3;
        piVar11[6] = extraout_XMM0_Bg_05 + cStack_d2;
        piVar11[7] = extraout_XMM0_Bh_05 + cStack_d1;
        piVar11[8] = extraout_XMM0_Bi_05 + cStack_d0;
        piVar11[9] = extraout_XMM0_Bj_05 + cStack_cf;
        piVar11[10] = extraout_XMM0_Bk_05 + cStack_ce;
        piVar11[0xb] = extraout_XMM0_Bl_05 + cStack_cd;
        piVar11[0xc] = extraout_XMM0_Bm_05 + cStack_cc;
        piVar11[0xd] = extraout_XMM0_Bn_05 + cStack_cb;
        piVar11[0xe] = extraout_XMM0_Bo_05 + cStack_ca;
        piVar11[0xf] = extraout_XMM0_Bp_05 + cStack_c9;
        levels = levels + 0x20;
        lVar10 = lVar10 + 4;
        uVar13 = 0x1515151515151515;
        uVar15 = 0x1515151515151515;
      } while (iVar12 != (int)lVar10);
    }
    *coeff_contexts = '\0';
  }
LAB_0031567a:
  iVar12 = iVar12 << (*(byte *)(tx_size_high_log2 + uVar7) & 0x1f);
  sVar2 = scan[iVar6];
  if (iVar12 / 8 < iVar6) {
    if (iVar12 / 4 < iVar6) {
      coeff_contexts[sVar2] = '\x03';
    }
    else {
      coeff_contexts[sVar2] = '\x02';
    }
  }
  else {
    coeff_contexts[sVar2] = '\x01';
  }
  return;
}

Assistant:

void av1_get_nz_map_contexts_sse2(const uint8_t *const levels,
                                  const int16_t *const scan, const uint16_t eob,
                                  const TX_SIZE tx_size,
                                  const TX_CLASS tx_class,
                                  int8_t *const coeff_contexts) {
  const int last_idx = eob - 1;
  if (!last_idx) {
    coeff_contexts[0] = 0;
    return;
  }

  const int real_width = tx_size_wide[tx_size];
  const int real_height = tx_size_high[tx_size];
  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  const int stride = height + TX_PAD_HOR;
  ptrdiff_t offsets[3];

  /* coeff_contexts must be 16 byte aligned. */
  assert(!((intptr_t)coeff_contexts & 0xf));

  if (tx_class == TX_CLASS_2D) {
    offsets[0] = 0 * stride + 2;
    offsets[1] = 1 * stride + 1;
    offsets[2] = 2 * stride + 0;

    if (height == 4) {
      get_4_nz_map_contexts_2d(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_2d(levels, width, offsets, coeff_contexts);
    } else if (height == 16) {
      get_16n_coeff_contexts_2d(levels, real_width, real_height, width, height,
                                offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_2d(levels, real_width, real_height, width, height,
                                offsets, coeff_contexts);
    }
  } else if (tx_class == TX_CLASS_HORIZ) {
    offsets[0] = 2 * stride;
    offsets[1] = 3 * stride;
    offsets[2] = 4 * stride;
    if (height == 4) {
      get_4_nz_map_contexts_hor(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_hor(levels, width, offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_hor(levels, width, height, offsets,
                                 coeff_contexts);
    }
  } else {  // TX_CLASS_VERT
    offsets[0] = 2;
    offsets[1] = 3;
    offsets[2] = 4;
    if (height == 4) {
      get_4_nz_map_contexts_ver(levels, width, offsets, coeff_contexts);
    } else if (height == 8) {
      get_8_coeff_contexts_ver(levels, width, offsets, coeff_contexts);
    } else {
      get_16n_coeff_contexts_ver(levels, width, height, offsets,
                                 coeff_contexts);
    }
  }

  const int bhl = get_txb_bhl(tx_size);
  const int pos = scan[last_idx];
  if (last_idx <= (width << bhl) / 8)
    coeff_contexts[pos] = 1;
  else if (last_idx <= (width << bhl) / 4)
    coeff_contexts[pos] = 2;
  else
    coeff_contexts[pos] = 3;
}